

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O3

PmDeviceInfo * Pm_GetDeviceInfo(PmDeviceID id)

{
  descriptor_type paVar1;
  
  if (pm_initialized == 0) {
    pm_hosterror = 0;
    pm_hosterror_text[0] = '\0';
    pm_init();
    pm_initialized = 1;
  }
  paVar1 = descriptors + (uint)id;
  if (pm_descriptor_index <= id) {
    paVar1 = (descriptor_type)0x0;
  }
  if (id < 0) {
    paVar1 = (descriptor_type)0x0;
  }
  return &paVar1->pub;
}

Assistant:

PMEXPORT const PmDeviceInfo* Pm_GetDeviceInfo( PmDeviceID id ) {
    Pm_Initialize(); /* no error check needed */
    if (id >= 0 && id < pm_descriptor_index) {
        return &descriptors[id].pub;
    }
    return NULL;
}